

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::ConsoleReporter::printHeaderString(ConsoleReporter *this,string *_string,size_t indent)

{
  long lVar1;
  ostream *poVar2;
  long lVar3;
  char local_59;
  Column local_58;
  
  lVar1 = std::__cxx11::string::find((char *)_string,0x1686ac,0);
  lVar3 = lVar1 + 2;
  if (lVar1 == -1) {
    lVar3 = 0;
  }
  poVar2 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  clara::TextFlow::Column::Column(&local_58,_string);
  local_58.m_indent = lVar3 + indent;
  local_58.m_initialIndent = indent;
  poVar2 = clara::TextFlow::operator<<(poVar2,&local_58);
  local_59 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,&local_59,1);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58.m_strings);
  return;
}

Assistant:

void ConsoleReporter::printHeaderString(std::string const& _string, std::size_t indent) {
    std::size_t i = _string.find(": ");
    if (i != std::string::npos)
        i += 2;
    else
        i = 0;
    stream << Column(_string).indent(indent + i).initialIndent(indent) << '\n';
}